

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::MenuItemEx(char *label,char *icon,char *shortcut,bool selected,bool enabled)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *draw_list;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  undefined4 w_label;
  bool bVar5;
  bool bVar6;
  ImU32 col;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar9;
  undefined4 uVar10;
  ImVec2 local_a8;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ImGuiWindow *local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar2->DC).CursorPos;
    IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uStack_70 = extraout_XMM0_Dc;
    local_78._0_4_ = IVar3.x;
    local_78._4_4_ = IVar3.y;
    uStack_6c = extraout_XMM0_Dd;
    bVar5 = IsRootOfOpenMenuSet();
    local_60 = pIVar4->NavWindow;
    if (bVar5) {
      pIVar4->NavWindow = pIVar2;
    }
    PushID(label);
    if (!enabled) {
      BeginDisabled(true);
    }
    if ((pIVar2->DC).LayoutType == 0) {
      local_90.x = (pIVar4->Style).ItemSpacing.x;
      fVar7 = (float)(int)(local_90.x * 0.5) + (pIVar2->DC).CursorPos.x;
      (pIVar2->DC).CursorPos.x = fVar7;
      IVar1.y = (pIVar2->DC).CursorPos.y + (pIVar2->DC).CurrLineTextBaseOffset;
      IVar1.x = fVar7 + (float)(pIVar2->DC).MenuColumns.OffsetLabel;
      local_90.x = local_90.x + local_90.x;
      local_90.y = (pIVar4->Style).ItemSpacing.y;
      PushStyleVar(0xe,&local_90);
      local_90.x = (float)local_78._0_4_;
      local_90.y = 0.0;
      bVar6 = Selectable("",selected,0x4800000,&local_90);
      PopStyleVar(1);
      RenderText(IVar1,label,(char *)0x0,true);
      (pIVar2->DC).CursorPos.x =
           (float)(int)((pIVar4->Style).ItemSpacing.x * -0.5) + (pIVar2->DC).CursorPos.x;
    }
    else {
      local_48 = 0.0;
      fStack_44 = 0.0;
      uStack_40 = 0;
      uStack_3c = 0;
      if ((icon != (char *)0x0) && (*icon != '\0')) {
        IVar3 = CalcTextSize(icon,(char *)0x0,false,-1.0);
        local_48 = IVar3.x;
        fStack_44 = IVar3.y;
        uStack_40 = extraout_XMM0_Dc_00;
        uStack_3c = extraout_XMM0_Dd_00;
      }
      uVar10 = 0;
      uVar9 = 0;
      fVar8 = 0.0;
      fVar7 = 0.0;
      if ((shortcut != (char *)0x0) && (*shortcut != '\0')) {
        IVar3 = CalcTextSize(shortcut,(char *)0x0,false,-1.0);
        fVar7 = IVar3.x;
        fVar8 = IVar3.y;
        uVar9 = extraout_XMM0_Dc_01;
        uVar10 = extraout_XMM0_Dd_01;
      }
      w_label = local_78._0_4_;
      local_78._4_4_ = fVar8;
      local_78._0_4_ = fVar7;
      uStack_70 = uVar9;
      uStack_6c = uVar10;
      local_88 = ImGuiMenuColumns::DeclColumns
                           (&(pIVar2->DC).MenuColumns,local_48,(float)w_label,fVar7,
                            (float)(int)(pIVar4->FontSize * 1.2));
      IVar3 = GetContentRegionAvail();
      fVar7 = IVar3.x - local_88;
      local_58 = ZEXT416(~-(uint)(fVar7 <= 0.0) & (uint)fVar7);
      local_90.x = local_88;
      local_90.y = 0.0;
      bVar6 = Selectable("",false,0x5800000,&local_90);
      local_a8.x = IVar1.x;
      local_a8.y = IVar1.y;
      local_88 = (float)(pIVar2->DC).MenuColumns.OffsetLabel + local_a8.x;
      fStack_84 = local_a8.y + 0.0;
      uStack_80 = 0;
      uStack_7c = 0;
      IVar3.y = fStack_84;
      IVar3.x = local_88;
      RenderText(IVar3,label,(char *)0x0,true);
      if (0.0 < local_48) {
        pos.y = fStack_84;
        pos.x = (float)(pIVar2->DC).MenuColumns.OffsetIcon + local_a8.x;
        RenderText(pos,icon,(char *)0x0,true);
      }
      if (0.0 < (float)local_78._0_4_) {
        PushStyleColor(0,(pIVar4->Style).Colors + 1);
        pos_00.y = fStack_84;
        pos_00.x = (float)(pIVar2->DC).MenuColumns.OffsetShortcut + (float)local_58._0_4_ +
                   local_a8.x;
        RenderText(pos_00,shortcut,(char *)0x0,false);
        PopStyleColor(1);
      }
      if (selected) {
        draw_list = pIVar2->DrawList;
        local_a8.y = local_a8.y + pIVar4->FontSize * 0.134 * 0.5;
        local_a8.x = local_a8.x +
                     pIVar4->FontSize * 0.4 +
                     (float)local_58._0_4_ + (float)(pIVar2->DC).MenuColumns.OffsetMark;
        col = GetColorU32(0,1.0);
        RenderCheckMark(draw_list,local_a8,col,pIVar4->FontSize * 0.866);
      }
    }
    if (!enabled) {
      EndDisabled();
    }
    PopID();
    if (bVar5) {
      pIVar4->NavWindow = local_60;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}